

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void Lib::swap(DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *l,
              DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *r)

{
  uint *in_RSI;
  uint *in_RDI;
  
  std::swap<unsigned_int>(in_RDI,in_RSI);
  std::swap<int>((int *)(in_RDI + 1),(int *)(in_RSI + 1));
  std::swap<int>((int *)(in_RDI + 2),(int *)(in_RSI + 2));
  std::swap<int>((int *)(in_RDI + 3),(int *)(in_RSI + 3));
  std::swap<int>((int *)(in_RDI + 4),(int *)(in_RSI + 4));
  std::swap<int>((int *)(in_RDI + 5),(int *)(in_RSI + 5));
  std::swap<Lib::DHMap<unsigned_int,unsigned_int,Lib::DefaultHash,Lib::DefaultHash2>::Entry*>
            ((Entry **)(in_RDI + 6),(Entry **)(in_RSI + 6));
  std::swap<Lib::DHMap<unsigned_int,unsigned_int,Lib::DefaultHash,Lib::DefaultHash2>::Entry*>
            ((Entry **)(in_RDI + 8),(Entry **)(in_RSI + 8));
  return;
}

Assistant:

void swap(DHMap& l, DHMap& r) 
  {
    std::swap(l._timestamp, r._timestamp);
    std::swap(l._size, r._size);
    std::swap(l._deleted, r._deleted);
    std::swap(l._capacityIndex, r._capacityIndex);
    std::swap(l._capacity, r._capacity);
    std::swap(l._nextExpansionOccupancy, r._nextExpansionOccupancy);
    std::swap(l._entries, r._entries);
    std::swap(l._afterLast, r._afterLast);
  }